

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isLikeOrGlob(Parse *pParse,Expr *pExpr,Expr **ppPrefix,int *pisComplete,int *pnoCase)

{
  Expr *pExpr_00;
  Vdbe *v_00;
  char cVar1;
  int iVar2;
  int iVar3;
  Expr *pExpr_01;
  bool bVar4;
  bool local_c6;
  int r1;
  Vdbe *v;
  double rDummy;
  char *pcStack_a8;
  int isNum;
  char *zNew;
  int iTo;
  int iFrom;
  Expr *pPrefix;
  Vdbe *pVStack_88;
  int iCol;
  Vdbe *pReprepare;
  int rc;
  int op;
  sqlite3_value *pVal;
  sqlite3 *db;
  int local_60;
  u8 wc [4];
  int cnt;
  u8 c;
  ExprList *pList;
  Expr *pLeft;
  Expr *pRight;
  u8 *z;
  int *pnoCase_local;
  int *pisComplete_local;
  Expr **ppPrefix_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  pRight = (Expr *)0x0;
  pVal = (sqlite3_value *)pParse->db;
  _rc = (sqlite3_value *)0x0;
  iVar2 = sqlite3IsLikeFunction((sqlite3 *)pVal,pExpr,pnoCase,(char *)((long)&db + 4));
  if (iVar2 == 0) {
    pParse_local._4_4_ = 0;
  }
  else {
    pExpr_00 = (Expr *)((pExpr->x).pSelect)->pEList;
    pExpr_01 = sqlite3ExprSkipCollate(*(Expr **)&((pExpr->x).pSelect)->iLimit);
    pReprepare._4_4_ = (uint)pExpr_01->op;
    if ((pReprepare._4_4_ == 0x9c) && (((ulong)pVal->xDel & 0x800000) == 0)) {
      pVStack_88 = pParse->pReprepare;
      pPrefix._4_4_ = (int)pExpr_01->iColumn;
      _rc = sqlite3VdbeGetBoundValue(pVStack_88,pPrefix._4_4_,'A');
      if ((_rc != (sqlite3_value *)0x0) && (iVar2 = sqlite3_value_type(_rc), iVar2 == 3)) {
        pRight = (Expr *)sqlite3_value_text(_rc);
      }
      sqlite3VdbeSetVarmask(pParse->pVdbe,pPrefix._4_4_);
    }
    else if (pReprepare._4_4_ == 0x75) {
      pRight = (Expr *)(pExpr_01->u).zToken;
    }
    if (pRight != (Expr *)0x0) {
      local_60 = 0;
      iVar2 = local_60;
      while( true ) {
        local_60 = iVar2;
        wc[3] = (&pRight->op)[local_60];
        bVar4 = false;
        if (((wc[3] != 0) && (bVar4 = false, wc[3] != db._4_1_)) &&
           (bVar4 = false, wc[3] != db._5_1_)) {
          bVar4 = wc[3] != db._6_1_;
        }
        if (!bVar4) break;
        iVar2 = local_60 + 1;
        if ((wc[3] == db._7_1_) && ((&pRight->op)[iVar2] != '\0')) {
          iVar2 = local_60 + 2;
        }
      }
      if (((local_60 < 2) && ((local_60 < 1 || (pRight->op == db._7_1_)))) ||
         ((&pRight->op)[local_60 + -1] == 0xff)) {
        pRight = (Expr *)0x0;
      }
      else {
        local_c6 = false;
        if (wc[3] == db._4_1_) {
          local_c6 = (&pRight->op)[local_60 + 1] == '\0';
        }
        *pisComplete = (uint)local_c6;
        _iTo = sqlite3Expr((sqlite3 *)pVal,0x75,(char *)pRight);
        if (_iTo != (Expr *)0x0) {
          pcStack_a8 = (_iTo->u).zToken;
          pcStack_a8[local_60] = '\0';
          zNew._0_4_ = 0;
          for (zNew._4_4_ = 0; zNew._4_4_ < local_60; zNew._4_4_ = zNew._4_4_ + 1) {
            if ((int)pcStack_a8[zNew._4_4_] == (uint)db._7_1_) {
              zNew._4_4_ = zNew._4_4_ + 1;
            }
            pcStack_a8[(int)zNew] = pcStack_a8[zNew._4_4_];
            zNew._0_4_ = (int)zNew + 1;
          }
          pcStack_a8[(int)zNew] = '\0';
          if (((pExpr_00->op != 0xa7) || (cVar1 = sqlite3ExprAffinity(pExpr_00), cVar1 != 'B')) ||
             (((pExpr_00->flags & 0x3000000) == 0 &&
              (((pExpr_00->y).pTab != (Table *)0x0 && (((pExpr_00->y).pTab)->eTabType == '\x01')))))
             ) {
            rDummy._4_4_ = sqlite3AtoF(pcStack_a8,(double *)&v,(int)zNew,'\x01');
            if (rDummy._4_4_ < 1) {
              if (((int)zNew == 1) && (*pcStack_a8 == '-')) {
                rDummy._4_4_ = 1;
              }
              else {
                pcStack_a8[(int)zNew + -1] = pcStack_a8[(int)zNew + -1] + '\x01';
                rDummy._4_4_ = sqlite3AtoF(pcStack_a8,(double *)&v,(int)zNew,'\x01');
                pcStack_a8[(int)zNew + -1] = pcStack_a8[(int)zNew + -1] + -1;
              }
            }
            if (0 < rDummy._4_4_) {
              sqlite3ExprDelete((sqlite3 *)pVal,_iTo);
              sqlite3ValueFree(_rc);
              return 0;
            }
          }
        }
        *ppPrefix = _iTo;
        if (pReprepare._4_4_ == 0x9c) {
          v_00 = pParse->pVdbe;
          sqlite3VdbeSetVarmask(v_00,(int)pExpr_01->iColumn);
          if ((*pisComplete != 0) && ((pExpr_01->u).zToken[1] != '\0')) {
            iVar2 = sqlite3GetTempReg(pParse);
            sqlite3ExprCodeTarget(pParse,pExpr_01,iVar2);
            iVar3 = sqlite3VdbeCurrentAddr(v_00);
            sqlite3VdbeChangeP3(v_00,iVar3 + -1,0);
            sqlite3ReleaseTempReg(pParse,iVar2);
          }
        }
      }
    }
    pReprepare._0_4_ = (uint)(pRight != (Expr *)0x0);
    sqlite3ValueFree(_rc);
    pParse_local._4_4_ = (uint)pReprepare;
  }
  return pParse_local._4_4_;
}

Assistant:

static int isLikeOrGlob(
  Parse *pParse,    /* Parsing and code generating context */
  Expr *pExpr,      /* Test this expression */
  Expr **ppPrefix,  /* Pointer to TK_STRING expression with pattern prefix */
  int *pisComplete, /* True if the only wildcard is % in the last character */
  int *pnoCase      /* True if uppercase is equivalent to lowercase */
){
  const u8 *z = 0;           /* String on RHS of LIKE operator */
  Expr *pRight, *pLeft;      /* Right and left size of LIKE operator */
  ExprList *pList;           /* List of operands to the LIKE operator */
  u8 c;                      /* One character in z[] */
  int cnt;                   /* Number of non-wildcard prefix characters */
  u8 wc[4];                  /* Wildcard characters */
  sqlite3 *db = pParse->db;  /* Database connection */
  sqlite3_value *pVal = 0;
  int op;                    /* Opcode of pRight */
  int rc;                    /* Result code to return */

  if( !sqlite3IsLikeFunction(db, pExpr, pnoCase, (char*)wc) ){
    return 0;
  }
#ifdef SQLITE_EBCDIC
  if( *pnoCase ) return 0;
#endif
  assert( ExprUseXList(pExpr) );
  pList = pExpr->x.pList;
  pLeft = pList->a[1].pExpr;

  pRight = sqlite3ExprSkipCollate(pList->a[0].pExpr);
  op = pRight->op;
  if( op==TK_VARIABLE && (db->flags & SQLITE_EnableQPSG)==0 ){
    Vdbe *pReprepare = pParse->pReprepare;
    int iCol = pRight->iColumn;
    pVal = sqlite3VdbeGetBoundValue(pReprepare, iCol, SQLITE_AFF_BLOB);
    if( pVal && sqlite3_value_type(pVal)==SQLITE_TEXT ){
      z = sqlite3_value_text(pVal);
    }
    sqlite3VdbeSetVarmask(pParse->pVdbe, iCol);
    assert( pRight->op==TK_VARIABLE || pRight->op==TK_REGISTER );
  }else if( op==TK_STRING ){
    assert( !ExprHasProperty(pRight, EP_IntValue) );
     z = (u8*)pRight->u.zToken;
  }
  if( z ){

    /* Count the number of prefix characters prior to the first wildcard */
    cnt = 0;
    while( (c=z[cnt])!=0 && c!=wc[0] && c!=wc[1] && c!=wc[2] ){
      cnt++;
      if( c==wc[3] && z[cnt]!=0 ) cnt++;
    }

    /* The optimization is possible only if (1) the pattern does not begin
    ** with a wildcard and if (2) the non-wildcard prefix does not end with
    ** an (illegal 0xff) character, or (3) the pattern does not consist of
    ** a single escape character. The second condition is necessary so
    ** that we can increment the prefix key to find an upper bound for the
    ** range search. The third is because the caller assumes that the pattern
    ** consists of at least one character after all escapes have been
    ** removed.  */
    if( (cnt>1 || (cnt>0 && z[0]!=wc[3])) && 255!=(u8)z[cnt-1] ){
      Expr *pPrefix;

      /* A "complete" match if the pattern ends with "*" or "%" */
      *pisComplete = c==wc[0] && z[cnt+1]==0;

      /* Get the pattern prefix.  Remove all escapes from the prefix. */
      pPrefix = sqlite3Expr(db, TK_STRING, (char*)z);
      if( pPrefix ){
        int iFrom, iTo;
        char *zNew;
        assert( !ExprHasProperty(pPrefix, EP_IntValue) );
        zNew = pPrefix->u.zToken;
        zNew[cnt] = 0;
        for(iFrom=iTo=0; iFrom<cnt; iFrom++){
          if( zNew[iFrom]==wc[3] ) iFrom++;
          zNew[iTo++] = zNew[iFrom];
        }
        zNew[iTo] = 0;
        assert( iTo>0 );

        /* If the LHS is not an ordinary column with TEXT affinity, then the
        ** pattern prefix boundaries (both the start and end boundaries) must
        ** not look like a number.  Otherwise the pattern might be treated as
        ** a number, which will invalidate the LIKE optimization.
        **
        ** Getting this right has been a persistent source of bugs in the
        ** LIKE optimization.  See, for example:
        **    2018-09-10 https://sqlite.org/src/info/c94369cae9b561b1
        **    2019-05-02 https://sqlite.org/src/info/b043a54c3de54b28
        **    2019-06-10 https://sqlite.org/src/info/fd76310a5e843e07
        **    2019-06-14 https://sqlite.org/src/info/ce8717f0885af975
        **    2019-09-03 https://sqlite.org/src/info/0f0428096f17252a
        */
        if( pLeft->op!=TK_COLUMN
         || sqlite3ExprAffinity(pLeft)!=SQLITE_AFF_TEXT
         || (ALWAYS( ExprUseYTab(pLeft) )
             && ALWAYS(pLeft->y.pTab)
             && IsVirtual(pLeft->y.pTab))  /* Might be numeric */
        ){
          int isNum;
          double rDummy;
          isNum = sqlite3AtoF(zNew, &rDummy, iTo, SQLITE_UTF8);
          if( isNum<=0 ){
            if( iTo==1 && zNew[0]=='-' ){
              isNum = +1;
            }else{
              zNew[iTo-1]++;
              isNum = sqlite3AtoF(zNew, &rDummy, iTo, SQLITE_UTF8);
              zNew[iTo-1]--;
            }
          }
          if( isNum>0 ){
            sqlite3ExprDelete(db, pPrefix);
            sqlite3ValueFree(pVal);
            return 0;
          }
        }
      }
      *ppPrefix = pPrefix;

      /* If the RHS pattern is a bound parameter, make arrangements to
      ** reprepare the statement when that parameter is rebound */
      if( op==TK_VARIABLE ){
        Vdbe *v = pParse->pVdbe;
        sqlite3VdbeSetVarmask(v, pRight->iColumn);
        assert( !ExprHasProperty(pRight, EP_IntValue) );
        if( *pisComplete && pRight->u.zToken[1] ){
          /* If the rhs of the LIKE expression is a variable, and the current
          ** value of the variable means there is no need to invoke the LIKE
          ** function, then no OP_Variable will be added to the program.
          ** This causes problems for the sqlite3_bind_parameter_name()
          ** API. To work around them, add a dummy OP_Variable here.
          */
          int r1 = sqlite3GetTempReg(pParse);
          sqlite3ExprCodeTarget(pParse, pRight, r1);
          sqlite3VdbeChangeP3(v, sqlite3VdbeCurrentAddr(v)-1, 0);
          sqlite3ReleaseTempReg(pParse, r1);
        }
      }
    }else{
      z = 0;
    }
  }

  rc = (z!=0);
  sqlite3ValueFree(pVal);
  return rc;
}